

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sftp.c
# Opt level: O3

size_t libssh2_sftp_tell(LIBSSH2_SFTP_HANDLE *handle)

{
  if (handle != (LIBSSH2_SFTP_HANDLE *)0x0) {
    return (handle->u).file.offset;
  }
  return 0;
}

Assistant:

LIBSSH2_API size_t
libssh2_sftp_tell(LIBSSH2_SFTP_HANDLE *handle)
{
    if(!handle)
        return 0; /* no handle, no size */

    /* NOTE: this may very well truncate the size if it is larger than what
       size_t can hold, so libssh2_sftp_tell64() is really the function you
       should use */
    return (size_t)(handle->u.file.offset);
}